

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  value_type peVar1;
  size_type sVar2;
  value_type *ppeVar3;
  reference ppeVar4;
  size_t sVar5;
  cb_class *pcVar6;
  v_array<COST_SENSITIVE::wclass> *this;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  bool keep_example;
  wclass wc;
  label ld;
  size_t i;
  bool shared;
  wclass *in_stack_ffffffffffffff88;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffff90;
  value_type *__x;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  v_array<CB::cb_class> local_48;
  value_type *local_28;
  byte local_19;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,0);
  local_19 = CB::ec_is_example_header
                       ((example *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
  *(size_type *)(local_8 + 8) = sVar2 + *(long *)(local_8 + 8);
  if ((local_19 & 1) != 0) {
    *(long *)(local_8 + 8) = *(long *)(local_8 + 8) + -1;
  }
  *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) + 1;
  std::vector<example_*,_std::allocator<example_*>_>::clear
            ((vector<example_*,_std::allocator<example_*>_> *)0x3d8c80);
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffff90);
  local_28 = (value_type *)0x0;
  while (__x = local_28,
        ppeVar3 = (value_type *)std::vector<example_*,_std::allocator<example_*>_>::size(local_10),
        __x < ppeVar3) {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_10,(size_type)local_28);
    peVar1 = *ppeVar4;
    local_48._begin = *(cb_class **)&(peVar1->l).multi;
    local_48._end = (cb_class *)(peVar1->l).cs.costs._end;
    local_48.end_array = (cb_class *)(peVar1->l).cs.costs.end_array;
    local_48.erase_count = (peVar1->l).cs.costs.erase_count;
    memset(&stack0xffffffffffffffa8,0,0x10);
    bVar7 = 0;
    if (((local_19 & 1) == 0) || (local_28 != (value_type *)0x0)) {
      sVar5 = v_array<CB::cb_class>::size(&local_48);
      if (sVar5 == 1) {
        pcVar6 = v_array<CB::cb_class>::operator[](&local_48,0);
        if ((pcVar6->cost != 3.4028235e+38) || (NAN(pcVar6->cost))) {
          v_array<CB::cb_class>::operator[](&local_48,0);
          *(int *)(local_8 + 0x18) = (int)local_28;
          bVar7 = 1;
        }
      }
    }
    else {
      bVar7 = 1;
    }
    if ((bVar7 & 1) != 0) {
      this = (v_array<COST_SENSITIVE::wclass> *)(local_8 + 0x20);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,(size_type)local_28);
      std::vector<example_*,_std::allocator<example_*>_>::push_back
                ((vector<example_*,_std::allocator<example_*>_> *)
                 CONCAT17(bVar7,in_stack_ffffffffffffffa0),__x);
      v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffff88);
    }
    local_28 = (value_type *)((long)local_28 + 1);
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  bool shared = CB::ec_is_example_header(*(ec_seq[0]));
  c.action_sum += ec_seq.size();
  if (shared)
    c.action_sum -= 1;
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (shared && i == 0)
    {
      wc.x = -FLT_MAX;
      keep_example = true;
    }
    else if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}